

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::reset(QWizardPrivate *this)

{
  long lVar1;
  bool bVar2;
  QWizard *pQVar3;
  reference piVar4;
  QWizardPagePrivate *pQVar5;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QWizardPage *page;
  add_const_t<QMap<int,_QWizardPage_*>_> *__range2;
  QWizard *q;
  const_iterator __end2;
  const_iterator __begin2;
  const_reverse_iterator it;
  const_reverse_iterator end;
  QWizard *in_stack_ffffffffffffffa8;
  QList<int> *in_stack_ffffffffffffffb8;
  QWizardPrivate *in_stack_ffffffffffffffc0;
  PageMap *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  if (in_RDI->current != -1) {
    QWizard::currentPage((QWizard *)in_RDI);
    QWidget::hide((QWidget *)0x7b4ef6);
    cleanupPagesNotInHistory(in_stack_ffffffffffffffc0);
    QList<int>::crend(in_stack_ffffffffffffffb8);
    QList<int>::crbegin(in_stack_ffffffffffffffb8);
    while( true ) {
      bVar2 = std::operator!=((reverse_iterator<QList<int>::const_iterator> *)in_RDI,
                              (reverse_iterator<QList<int>::const_iterator> *)
                              in_stack_ffffffffffffffa8);
      if (!bVar2) break;
      in_stack_ffffffffffffffa8 = pQVar3;
      piVar4 = std::reverse_iterator<QList<int>::const_iterator>::operator*
                         ((reverse_iterator<QList<int>::const_iterator> *)in_RDI);
      (**(code **)(*(long *)&(in_stack_ffffffffffffffa8->super_QDialog).super_QWidget + 0x1e0))
                (in_stack_ffffffffffffffa8,*piVar4);
      std::reverse_iterator<QList<int>::const_iterator>::operator++
                ((reverse_iterator<QList<int>::const_iterator> *)in_RDI);
    }
    QList<int>::clear((QList<int> *)in_RDI);
    this_00 = &in_RDI->pageMap;
    QMap<int,_QWizardPage_*>::begin(this_00);
    QMap<int,_QWizardPage_*>::end(this_00);
    while( true ) {
      bVar2 = ::operator!=((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffffa8);
      if (!bVar2) break;
      QMap<int,_QWizardPage_*>::const_iterator::operator*((const_iterator *)0x7b500c);
      pQVar5 = QWizardPage::d_func((QWizardPage *)0x7b501e);
      pQVar5->initialized = false;
      QMap<int,_QWizardPage_*>::const_iterator::operator++((const_iterator *)in_RDI);
    }
    in_RDI->current = -1;
    QWizard::currentIdChanged((QWizard *)0x7b504f,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::reset()
{
    Q_Q(QWizard);
    if (current != -1) {
        q->currentPage()->hide();
        cleanupPagesNotInHistory();
        const auto end = history.crend();
        for (auto it = history.crbegin(); it != end; ++it)
            q->cleanupPage(*it);
        history.clear();
        for (QWizardPage *page : std::as_const(pageMap))
            page->d_func()->initialized = false;

        current = -1;
        emit q->currentIdChanged(-1);
    }
}